

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SpiAnalyzerResults::GenerateBubbleText
          (SpiAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  byte bVar1;
  char local_168 [8];
  char number_str_1 [128];
  char number_str [128];
  Frame local_50 [8];
  Frame frame;
  ulonglong local_40;
  ulonglong local_38;
  byte local_2f;
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  SpiAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  if ((local_2f & 1) == 0) {
    bVar1 = Channel::operator==(channel,&this->mSettings->mMosiChannel);
    if ((bVar1 & 1) == 0) {
      AnalyzerHelpers::GetNumberString
                (local_38,display_base,this->mSettings->mBitsPerTransfer,local_168,0x80);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_40,display_base,this->mSettings->mBitsPerTransfer,number_str_1 + 0x78,0x80);
      AnalyzerResults::AddResultString
                ((char *)this,number_str_1 + 0x78,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Settings mismatch",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"The initial (idle) state of the CLK line does not match the settings.",
               (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void SpiAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    if( ( frame.mFlags & SPI_ERROR_FLAG ) == 0 )
    {
        if( channel == mSettings->mMosiChannel )
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerTransfer, number_str, 128 );
            AddResultString( number_str );
        }
        else
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2, display_base, mSettings->mBitsPerTransfer, number_str, 128 );
            AddResultString( number_str );
        }
    }
    else
    {
        AddResultString( "Error" );
        AddResultString( "Settings mismatch" );
        AddResultString( "The initial (idle) state of the CLK line does not match the settings." );
    }
}